

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_ManSatSolveSeq_rec
               (Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vInfo,int iPat,int nRegs)

{
  int iVar1;
  int iVar2;
  uint *p_00;
  Gia_Obj_t *pGVar3;
  uint *pInfo;
  int nRegs_local;
  int iPat_local;
  Vec_Ptr_t *vInfo_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Cec_ManSat_t *pSat_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                      ,0x37b,
                      "void Cec_ManSatSolveSeq_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, int, int)"
                     );
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      Cec_ManSatSolveSeq_rec(pSat,p,pGVar3,vInfo,iPat,nRegs);
      pGVar3 = Gia_ObjFanin1(pObj);
      Cec_ManSatSolveSeq_rec(pSat,p,pGVar3,vInfo,iPat,nRegs);
    }
    else {
      iVar1 = Gia_ObjCioId(pObj);
      p_00 = (uint *)Vec_PtrEntry(vInfo,nRegs + iVar1);
      iVar1 = Cec_ObjSatVarValue(pSat,pObj);
      iVar2 = Abc_InfoHasBit(p_00,iPat);
      if (iVar1 != iVar2) {
        Abc_InfoXorBit(p_00,iPat);
      }
      pSat->nCexLits = pSat->nCexLits + 1;
    }
  }
  return;
}

Assistant:

void Cec_ManSatSolveSeq_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vInfo, int iPat, int nRegs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        unsigned * pInfo = (unsigned *)Vec_PtrEntry( vInfo, nRegs + Gia_ObjCioId(pObj) );
        if ( Cec_ObjSatVarValue( pSat, pObj ) != Abc_InfoHasBit( pInfo, iPat ) )
            Abc_InfoXorBit( pInfo, iPat );
        pSat->nCexLits++;
//        Vec_IntPush( pSat->vCex, Abc_Var2Lit( Gia_ObjCioId(pObj), !Cec_ObjSatVarValue(pSat, pObj) ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManSatSolveSeq_rec( pSat, p, Gia_ObjFanin0(pObj), vInfo, iPat, nRegs );
    Cec_ManSatSolveSeq_rec( pSat, p, Gia_ObjFanin1(pObj), vInfo, iPat, nRegs );
}